

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorDebug.cpp
# Opt level: O2

void debugReportMarkSingC
               (HighsInt call_id,HighsInt highs_debug_level,HighsLogOptions *log_options,
               HighsInt num_row,vector<int,_std::allocator<int>_> *iwork,HighsInt *basic_index)

{
  ulong uVar1;
  HighsInt i;
  uint uVar2;
  
  if (num_row < 0x7c && highs_debug_level != 0) {
    if (call_id == 1) {
      highsLogDev(log_options,kWarning,"\nMarkSingC2");
      highsLogDev(log_options,kWarning,"\nIndex  ");
      if (num_row < 1) {
        num_row = 0;
      }
      for (uVar2 = 0; num_row != uVar2; uVar2 = uVar2 + 1) {
        highsLogDev(log_options,kWarning," %2d",(ulong)uVar2);
      }
      highsLogDev(log_options,kWarning,"\nNwBaseI");
      for (uVar1 = 0; (uint)num_row != uVar1; uVar1 = uVar1 + 1) {
        highsLogDev(log_options,kWarning," %2d",(ulong)(uint)basic_index[uVar1]);
      }
      highsLogDev(log_options,kWarning,"\n");
      return;
    }
    if (call_id == 0) {
      highsLogDev(log_options,kWarning,"\nMarkSingC1");
      highsLogDev(log_options,kWarning,"\nIndex  ");
      if (num_row < 1) {
        num_row = 0;
      }
      for (uVar2 = 0; num_row != uVar2; uVar2 = uVar2 + 1) {
        highsLogDev(log_options,kWarning," %2d",(ulong)uVar2);
      }
      highsLogDev(log_options,kWarning,"\niwork  ");
      for (uVar1 = 0; (uint)num_row != uVar1; uVar1 = uVar1 + 1) {
        highsLogDev(log_options,kWarning," %2d",
                    (ulong)(uint)(iwork->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[uVar1]);
      }
      highsLogDev(log_options,kWarning,"\nBaseI  ");
      for (uVar1 = 0; (uint)num_row != uVar1; uVar1 = uVar1 + 1) {
        highsLogDev(log_options,kWarning," %2d",(ulong)(uint)basic_index[uVar1]);
      }
    }
  }
  return;
}

Assistant:

void debugReportMarkSingC(const HighsInt call_id,
                          const HighsInt highs_debug_level,
                          const HighsLogOptions& log_options,
                          const HighsInt num_row, const vector<HighsInt>& iwork,
                          const HighsInt* basic_index) {
  if (highs_debug_level == kHighsDebugLevelNone) return;
  if (num_row > 123) return;
  if (call_id == 0) {
    highsLogDev(log_options, HighsLogType::kWarning, "\nMarkSingC1");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\niwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nBaseI  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  basic_index[i]);
  } else if (call_id == 1) {
    highsLogDev(log_options, HighsLogType::kWarning, "\nMarkSingC2");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nNwBaseI");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  basic_index[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  }
}